

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

size_t pugi::impl::anon_unknown_0::zero_terminate_buffer
                 (void *buffer,size_t size,xml_encoding encoding)

{
  xml_encoding encoding_local;
  size_t size_local;
  void *buffer_local;
  
  buffer_local = (void *)size;
  if (encoding == encoding_utf8) {
    *(undefined1 *)((long)buffer + size) = 0;
    buffer_local = (void *)(size + 1);
  }
  return (size_t)buffer_local;
}

Assistant:

PUGI__FN size_t zero_terminate_buffer(void* buffer, size_t size, xml_encoding encoding)
	{
		// We only need to zero-terminate if encoding conversion does not do it for us
	#ifdef PUGIXML_WCHAR_MODE
		xml_encoding wchar_encoding = get_wchar_encoding();

		if (encoding == wchar_encoding || need_endian_swap_utf(encoding, wchar_encoding))
		{
			size_t length = size / sizeof(char_t);

			static_cast<char_t*>(buffer)[length] = 0;
			return (length + 1) * sizeof(char_t);
		}
	#else
		if (encoding == encoding_utf8)
		{
			static_cast<char*>(buffer)[size] = 0;
			return size + 1;
		}
	#endif

		return size;
	}